

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yin_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  byte bVar1;
  uint uVar2;
  char *__s;
  lys_node *__s_00;
  lyout *out_00;
  ushort uVar3;
  int iVar4;
  int iVar5;
  lys_module *plVar6;
  lys_module *plVar7;
  char *pcVar8;
  lys_node *plVar9;
  char *pcVar10;
  lys_node *plVar11;
  LYS_NODE LVar12;
  lys_when *plVar13;
  char *pcVar14;
  lys_ext_instance **pplVar15;
  lyout *plVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int local_4c;
  lyout *plStack_48;
  int content_1;
  lys_node *local_40;
  int local_34 [2];
  int content;
  
  LVar12 = mask & node->nodetype;
  plStack_48 = out;
  local_40 = node;
  if (0xff < (int)LVar12) {
    if ((int)LVar12 < 0x800) {
      if (LVar12 != LYS_RPC) {
        if ((LVar12 != LYS_INPUT) && (LVar12 != LYS_OUTPUT)) {
          return;
        }
        pcVar14 = "output";
        ly_print(out,"%*s<%s",(ulong)(uint)(level * 2),"");
        ly_print(out,">\n");
        iVar4 = level + 1;
        if (local_40->ext_size != 0) {
          yin_print_extension_instances
                    (out,iVar4,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                     (uint)local_40->ext_size);
        }
        if (local_40->padding[1] != '\0') {
          lVar17 = 0;
          uVar19 = 0;
          do {
            yin_print_must(out,iVar4,local_40->module,(lys_restr *)(local_40[1].name + lVar17));
            uVar19 = uVar19 + 1;
            lVar17 = lVar17 + 0x38;
          } while (uVar19 < local_40->padding[1]);
        }
        if (*(short *)(local_40->padding + 2) != 0) {
          lVar17 = 0;
          uVar19 = 0;
          do {
            yin_print_typedef(out,iVar4,local_40->module,
                              (lys_tpdf *)(*(long *)local_40->hash + lVar17));
            uVar19 = uVar19 + 1;
            lVar17 = lVar17 + 0x80;
          } while (uVar19 < *(ushort *)(local_40->padding + 2));
        }
        plVar9 = local_40->child;
        plVar11 = local_40;
        if (plVar9 != (lys_node *)0x0) {
          do {
            if (plVar9->parent == plVar11) {
              yin_print_snode(out,iVar4,plVar9,0x800);
              plVar11 = local_40;
            }
            plVar9 = plVar9->next;
          } while (plVar9 != (lys_node *)0x0);
          for (plVar9 = plVar11->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
            if (plVar9->parent == plVar11) {
              yin_print_snode(out,iVar4,plVar9,0x903f);
              plVar11 = local_40;
            }
          }
        }
        if (plVar11->nodetype == LYS_INPUT) {
          pcVar14 = "input";
        }
        goto LAB_0018e8a6;
      }
    }
    else {
      if ((int)LVar12 < 0x4000) {
        if (LVar12 == LYS_GROUPING) {
          local_34[0] = 0;
          yin_print_open(out,level,(char *)0x0,"grouping","name",node->name,0);
          iVar4 = level + 1;
          yin_print_snode_common(out,iVar4,local_40,local_40->module,local_34,0x71);
          if (*(short *)(local_40->padding + 2) != 0) {
            lVar17 = 0;
            uVar19 = 0;
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(plStack_48,">\n");
              }
              yin_print_typedef(plStack_48,iVar4,local_40->module,
                                (lys_tpdf *)(*(long *)local_40->hash + lVar17));
              uVar19 = uVar19 + 1;
              lVar17 = lVar17 + 0x80;
            } while (uVar19 < *(ushort *)(local_40->padding + 2));
          }
          plVar16 = plStack_48;
          plVar9 = local_40->child;
          if (plVar9 != (lys_node *)0x0) {
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(plVar16,">\n");
              }
              yin_print_snode(plVar16,iVar4,plVar9,0x800);
              out_00 = plStack_48;
              plVar9 = plVar9->next;
            } while (plVar9 != (lys_node *)0x0);
            plVar9 = local_40->child;
            if (plVar9 != (lys_node *)0x0) {
              do {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(out_00,">\n");
                }
                yin_print_snode(out_00,iVar4,plVar9,0x903f);
                plVar16 = plStack_48;
                plVar9 = plVar9->next;
              } while (plVar9 != (lys_node *)0x0);
              plVar9 = local_40->child;
              if (plVar9 != (lys_node *)0x0) {
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plVar16,">\n");
                  }
                  yin_print_snode(plVar16,iVar4,plVar9,0x4000);
                  plVar9 = plVar9->next;
                } while (plVar9 != (lys_node *)0x0);
                for (plVar9 = local_40->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plStack_48,">\n");
                  }
                  yin_print_snode(plStack_48,iVar4,plVar9,0x80);
                }
              }
            }
          }
          pcVar14 = "grouping";
          plVar16 = plStack_48;
          iVar4 = local_34[0];
        }
        else {
          if (LVar12 != LYS_USES) {
            return;
          }
          local_4c = 0;
          ly_print(out,"%*s<uses name=\"",(ulong)(uint)(level * 2),"");
          if (local_40->child != (lys_node *)0x0) {
            plVar6 = lys_node_module(local_40->child);
            plVar7 = lys_node_module(local_40);
            if (plVar7 != plVar6) {
              pcVar14 = transform_module_name2import_prefix(local_40->module,plVar6->name);
              ly_print(out,"%s:",pcVar14);
            }
          }
          ly_print(out,"%s\"",local_40->name);
          iVar4 = level + 1;
          yin_print_snode_common(out,iVar4,local_40,local_40->module,&local_4c,1);
          plVar13 = *(lys_when **)local_40->hash;
          if (plVar13 != (lys_when *)0x0) {
            if (local_4c == 0) {
              local_4c = 1;
              ly_print(plStack_48,">\n");
              plVar13 = *(lys_when **)local_40->hash;
            }
            out = plStack_48;
            yin_print_when(plStack_48,iVar4,local_40->module,plVar13);
          }
          yin_print_snode_common(out,iVar4,local_40,local_40->module,&local_4c,0x72);
          if (local_40->padding[2] != '\0') {
            iVar5 = level + 2;
            uVar19 = 0;
            do {
              if (local_4c == 0) {
                local_4c = 1;
                ly_print(plStack_48,">\n");
              }
              plVar6 = local_40->module;
              pcVar14 = local_40[1].name;
              lVar17 = uVar19 * 0x50;
              plVar9 = (lys_node *)(pcVar14 + lVar17);
              local_34[0] = 0;
              pcVar8 = transform_json2xml(plVar6,*(char **)(pcVar14 + lVar17),0,(char ***)0x0,
                                          (char ***)0x0,(uint32_t *)0x0);
              yin_print_open(plStack_48,iVar4,(char *)0x0,"refine","target-node",pcVar8,local_34[0])
              ;
              lydict_remove(plVar6->ctx,pcVar8);
              yin_print_snode_common(plStack_48,iVar5,plVar9,plVar6,local_34,3);
              if (pcVar14[lVar17 + 0x1e] != '\0') {
                lVar17 = 0;
                uVar18 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plStack_48,">\n");
                  }
                  yin_print_must(plStack_48,iVar5,plVar6,
                                 (lys_restr *)(*(long *)&plVar9->nodetype + lVar17));
                  uVar18 = uVar18 + 1;
                  lVar17 = lVar17 + 0x38;
                } while (uVar18 < plVar9->padding[2]);
              }
              plVar16 = plStack_48;
              if ((*(short *)plVar9->padding == 1) &&
                 (plVar11 = plVar9->child, plVar11 != (lys_node *)0x0)) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plStack_48,">\n");
                  plVar11 = plVar9->child;
                }
                yin_print_substmt(plVar16,iVar5,LYEXT_SUBSTMT_PRESENCE,'\0',(char *)plVar11,plVar6,
                                  plVar9->ext,(uint)plVar9->ext_size);
              }
              if (plVar9->padding[3] != '\0') {
                uVar18 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plVar16,">\n");
                  }
                  yin_print_substmt(plVar16,iVar5,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar18,
                                    *(char **)(plVar9->parent->padding + uVar18 * 8 + -0x1c),plVar6,
                                    plVar9->ext,(uint)plVar9->ext_size);
                  uVar18 = uVar18 + 1;
                } while (uVar18 < plVar9->padding[3]);
              }
              if ((plVar9->flags & 1) == 0) {
                if ((plVar9->flags & 2) != 0) {
                  pcVar14 = "false";
                  goto joined_r0x0018cdc6;
                }
              }
              else {
                pcVar14 = "true";
joined_r0x0018cdc6:
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar16,">\n");
                }
                yin_print_substmt(plVar16,iVar5,LYEXT_SUBSTMT_CONFIG,'\0',pcVar14,plVar6,plVar9->ext
                                  ,(uint)plVar9->ext_size);
              }
              if ((plVar9->flags & 0x40) == 0) {
                if ((char)plVar9->flags < '\0') {
                  pcVar14 = "false";
                  goto joined_r0x0018ce2a;
                }
              }
              else {
                pcVar14 = "true";
joined_r0x0018ce2a:
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar16,">\n");
                }
                yin_print_substmt(plVar16,iVar5,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar14,plVar6,
                                  plVar9->ext,(uint)plVar9->ext_size);
              }
              if ((plVar9->padding[0] & 0x18) != 0) {
                uVar3 = plVar9->flags;
                if ((uVar3 & 0x10) != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plVar16,">\n");
                  }
                  yin_print_unsigned(plVar16,iVar5,LYEXT_SUBSTMT_MIN,'\0',plVar6,plVar9->ext,
                                     (uint)plVar9->ext_size,*(uint *)&plVar9->child);
                  uVar3 = plVar9->flags;
                }
                if ((uVar3 & 8) != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plVar16,">\n");
                  }
                  uVar2 = *(uint *)((long)&plVar9->child + 4);
                  if (uVar2 == 0) {
                    yin_print_substmt(plVar16,iVar5,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plVar6,
                                      plVar9->ext,(uint)plVar9->ext_size);
                  }
                  else {
                    yin_print_unsigned(plVar16,iVar5,LYEXT_SUBSTMT_MAX,'\0',plVar6,plVar9->ext,
                                       (uint)plVar9->ext_size,uVar2);
                  }
                }
              }
              yin_print_snode_common(plVar16,iVar5,plVar9,plVar6,local_34,0x60);
              yin_print_close(plVar16,iVar4,(char *)0x0,"refine",local_34[0]);
              uVar19 = uVar19 + 1;
            } while (uVar19 < local_40->padding[2]);
          }
          if (local_40->padding[3] != '\0') {
            lVar17 = 0;
            uVar19 = 0;
            do {
              if (local_4c == 0) {
                local_4c = 1;
                ly_print(plStack_48,">\n");
              }
              yin_print_augment(plStack_48,iVar4,local_40->module,
                                (lys_node_augment *)(local_40[1].dsc + lVar17));
              uVar19 = uVar19 + 1;
              lVar17 = lVar17 + 0x68;
            } while (uVar19 < local_40->padding[3]);
          }
          pcVar14 = "uses";
          plVar16 = plStack_48;
          iVar4 = local_4c;
        }
        goto LAB_0018e780;
      }
      if (LVar12 != LYS_ACTION) {
        if (LVar12 != LYS_ANYDATA) {
          return;
        }
        goto LAB_0018d195;
      }
    }
    local_34[0] = 0;
    pcVar14 = "action";
    pcVar8 = "action";
    if (node->nodetype == LYS_RPC) {
      pcVar8 = "rpc";
    }
    yin_print_open(out,level,(char *)0x0,pcVar8,"name",node->name,0);
    iVar4 = level + 1;
    yin_print_snode_common(out,iVar4,local_40,local_40->module,local_34,0x73);
    if (*(short *)(local_40->padding + 2) != 0) {
      lVar17 = 0;
      uVar19 = 0;
      do {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_typedef(plStack_48,iVar4,local_40->module,(lys_tpdf *)(local_40[1].name + lVar17))
        ;
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + 0x80;
      } while (uVar19 < *(ushort *)(local_40->padding + 2));
    }
    plVar16 = plStack_48;
    plVar11 = local_40;
    for (plVar9 = local_40->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
      if ((plVar9->parent == plVar11) &&
         (((plVar9->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN ||
          ((plVar9->flags & 0x40) == 0)))) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
        }
        yin_print_snode(plVar16,iVar4,plVar9,0xe00);
        plVar11 = local_40;
      }
    }
    iVar4 = local_34[0];
    if (plVar11->nodetype == LYS_RPC) {
      pcVar14 = "rpc";
    }
    goto LAB_0018e780;
  }
  if ((int)LVar12 < 0x10) {
    switch(LVar12) {
    case LYS_CONTAINER:
      local_34[0] = 0;
      yin_print_open(out,level,(char *)0x0,"container","name",node->name,0);
      iVar4 = level + 1;
      yin_print_snode_common(out,iVar4,local_40,local_40->module,local_34,1);
      plVar13 = (lys_when *)local_40[1].name;
      if (plVar13 != (lys_when *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out,">\n");
          plVar13 = (lys_when *)local_40[1].name;
        }
        yin_print_when(out,iVar4,local_40->module,plVar13);
      }
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_iffeature(plStack_48,iVar4,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      if (local_40->padding[1] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_must(plStack_48,iVar4,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar19 < local_40->padding[1]);
      }
      plVar16 = plStack_48;
      pcVar14 = *(char **)&local_40[1].flags;
      if (pcVar14 != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
          pcVar14 = *(char **)&local_40[1].flags;
        }
        yin_print_substmt(plVar16,iVar4,LYEXT_SUBSTMT_PRESENCE,'\0',pcVar14,local_40->module,
                          local_40->ext,(uint)local_40->ext_size);
      }
      yin_print_snode_common(plVar16,iVar4,local_40,local_40->module,local_34,0x74);
      if (*(short *)(local_40->padding + 2) != 0) {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_typedef(plStack_48,iVar4,local_40->module,(lys_tpdf *)(local_40[1].ref + lVar17)
                           );
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x80;
        } while (uVar19 < *(ushort *)(local_40->padding + 2));
      }
      plVar16 = plStack_48;
      plVar9 = local_40->child;
      plVar11 = local_40;
      if (plVar9 != (lys_node *)0x0) {
        do {
          if (plVar9->parent == plVar11) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(plVar16,">\n");
            }
            yin_print_snode(plVar16,iVar4,plVar9,0x800);
            plVar11 = local_40;
          }
          plVar9 = plVar9->next;
        } while (plVar9 != (lys_node *)0x0);
        plVar9 = plVar11->child;
        if (plVar9 != (lys_node *)0x0) {
          do {
            if (plVar9->parent == plVar11) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(plVar16,">\n");
              }
              yin_print_snode(plVar16,iVar4,plVar9,0x903f);
              plVar11 = local_40;
            }
            plVar9 = plVar9->next;
          } while (plVar9 != (lys_node *)0x0);
          plVar9 = plVar11->child;
          if (plVar9 != (lys_node *)0x0) {
            do {
              if (plVar9->parent == plVar11) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar16,">\n");
                }
                yin_print_snode(plVar16,iVar4,plVar9,0x4000);
                plVar11 = local_40;
              }
              plVar9 = plVar9->next;
            } while (plVar9 != (lys_node *)0x0);
            for (plVar9 = plVar11->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
              if (plVar9->parent == plVar11) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar16,">\n");
                }
                yin_print_snode(plVar16,iVar4,plVar9,0x80);
                plVar11 = local_40;
              }
            }
          }
        }
      }
      pcVar14 = "container";
      iVar4 = local_34[0];
      break;
    case LYS_CHOICE:
      local_34[0] = 0;
      yin_print_open(out,level,(char *)0x0,"choice","name",node->name,0);
      iVar4 = level + 1;
      yin_print_snode_common(out,iVar4,local_40,local_40->module,local_34,1);
      plVar13 = *(lys_when **)local_40->hash;
      if (plVar13 != (lys_when *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out,">\n");
          plVar13 = *(lys_when **)local_40->hash;
        }
        yin_print_when(out,iVar4,local_40->module,plVar13);
      }
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_iffeature(plStack_48,iVar4,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      plVar16 = plStack_48;
      pcVar14 = local_40[1].name;
      if (pcVar14 != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
          pcVar14 = local_40[1].name;
        }
        yin_print_substmt(plVar16,iVar4,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)pcVar14,
                          local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      yin_print_snode_common(plVar16,iVar4,local_40,local_40->module,local_34,0x7c);
      plVar11 = local_40;
      for (plVar9 = local_40->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
        if (plVar9->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar4,plVar9,0x807f);
          plVar11 = local_40;
        }
      }
      pcVar14 = "choice";
      iVar4 = local_34[0];
      break;
    default:
      goto switchD_0018c6e9_caseD_3;
    case LYS_LEAF:
      yin_print_open(out,level,(char *)0x0,"leaf","name",node->name,1);
      iVar4 = level + 1;
      if (local_40->ext_size != 0) {
        yin_print_extension_instances
                  (out,iVar4,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
        yin_print_when(out,iVar4,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          yin_print_iffeature(out,iVar4,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      yin_print_type(out,iVar4,local_40->module,(lys_type *)&local_40[1].ref);
      yin_print_substmt(out,iVar4,LYEXT_SUBSTMT_UNITS,'\0',(char *)local_40[1].next,local_40->module
                        ,local_40->ext,(uint)local_40->ext_size);
      if (local_40->padding[3] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          yin_print_must(out,iVar4,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar19 < local_40->padding[3]);
      }
      plVar9 = local_40[1].prev;
      if (plVar9 != (lys_node *)0x0) {
        if ((local_40->flags & 0x1000) != 0) {
          pcVar14 = strchr((char *)plVar9,0x3a);
          plVar11 = local_40;
          if (pcVar14 == (char *)0x0) {
            __assert_fail("strchr(leaf->dflt, \':\')",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yin.c"
                          ,0x45f,"void yin_print_leaf(struct lyout *, int, const struct lys_node *)"
                         );
          }
          plVar6 = lys_node_module(local_40);
          pcVar14 = plVar6->name;
          __s_00 = plVar11[1].prev;
          pcVar8 = strchr((char *)__s_00,0x3a);
          iVar5 = strncmp((char *)plVar9,pcVar14,(long)pcVar8 - (long)__s_00);
          plVar6 = plVar11->module;
          if (iVar5 == 0) {
            plVar9 = (lys_node *)lydict_insert(plVar6->ctx,pcVar8 + 1,0);
          }
          else {
            plVar9 = (lys_node *)transform_json2schema(plVar6,(char *)__s_00);
          }
        }
        yin_print_substmt(plStack_48,iVar4,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)plVar9,
                          local_40->module,local_40->ext,(uint)local_40->ext_size);
        if ((local_40->flags & 0x1000) != 0) {
          lydict_remove(local_40->module->ctx,(char *)plVar9);
        }
      }
      out = plStack_48;
      yin_print_snode_common(plStack_48,iVar4,local_40,local_40->module,(int *)0x0,0x7c);
      pcVar14 = "leaf";
      goto LAB_0018e8a6;
    case LYS_LEAFLIST:
      yin_print_open(out,level,(char *)0x0,"leaf-list","name",node->name,1);
      iVar4 = level + 1;
      if (local_40->ext_size != 0) {
        yin_print_extension_instances
                  (out,iVar4,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
        yin_print_when(plStack_48,iVar4,local_40->module,(lys_when *)local_40[1].name);
      }
      plVar16 = plStack_48;
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          yin_print_iffeature(plVar16,iVar4,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      yin_print_type(plVar16,iVar4,local_40->module,(lys_type *)&local_40[1].ref);
      yin_print_substmt(plVar16,iVar4,LYEXT_SUBSTMT_UNITS,'\0',(char *)local_40[1].next,
                        local_40->module,local_40->ext,(uint)local_40->ext_size);
      if (local_40->padding[3] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          yin_print_must(plVar16,iVar4,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar19 < local_40->padding[3]);
      }
      if (local_40->padding[2] != '\0') {
        uVar19 = 0;
        do {
          pcVar14 = *(char **)((local_40[1].prev)->padding + uVar19 * 8 + -0x1c);
          if ((local_40->flags & 0x1000) != 0) {
            pcVar8 = strchr(pcVar14,0x3a);
            plVar9 = local_40;
            if (pcVar8 == (char *)0x0) {
              __assert_fail("strchr(llist->dflt[i], \':\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yin.c"
                            ,0x4b3,
                            "void yin_print_leaflist(struct lyout *, int, const struct lys_node *)")
              ;
            }
            plVar6 = lys_node_module(local_40);
            pcVar8 = plVar6->name;
            __s = *(char **)((plVar9[1].prev)->padding + uVar19 * 8 + -0x1c);
            pcVar10 = strchr(__s,0x3a);
            iVar5 = strncmp(pcVar14,pcVar8,(long)pcVar10 - (long)__s);
            plVar6 = plVar9->module;
            if (iVar5 == 0) {
              pcVar14 = lydict_insert(plVar6->ctx,pcVar10 + 1,0);
            }
            else {
              pcVar14 = transform_json2schema(plVar6,__s);
            }
          }
          yin_print_substmt(plStack_48,iVar4,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar19,pcVar14,
                            local_40->module,local_40->ext,(uint)local_40->ext_size);
          if ((local_40->flags & 0x1000) != 0) {
            lydict_remove(local_40->module->ctx,pcVar14);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < local_40->padding[2]);
      }
      plVar16 = plStack_48;
      yin_print_snode_common(plStack_48,iVar4,local_40,local_40->module,(int *)0x0,4);
      if (*(uint *)&local_40[1].priv != 0) {
        yin_print_unsigned(plVar16,iVar4,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,*(uint *)&local_40[1].priv);
      }
      uVar2 = *(uint *)((long)&local_40[1].priv + 4);
      if (uVar2 != 0) {
        yin_print_unsigned(plStack_48,iVar4,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,uVar2);
      }
      plVar9 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar5 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        out = plStack_48;
        if (iVar5 != -1) {
          pcVar14 = "system";
          goto LAB_0018e4ec;
        }
      }
      else {
        pcVar14 = "user";
LAB_0018e4ec:
        out = plStack_48;
        yin_print_substmt(plStack_48,iVar4,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar14,plVar9->module,
                          plVar9->ext,(uint)plVar9->ext_size);
      }
      yin_print_snode_common(out,iVar4,plVar9,plVar9->module,(int *)0x0,0x70);
      pcVar14 = "leaf-list";
LAB_0018e8a6:
      ly_print(out,"%*s</%s>\n",(ulong)(uint)(level * 2),"",pcVar14);
      return;
    }
  }
  else if ((int)LVar12 < 0x40) {
    if (LVar12 == LYS_LIST) {
      local_34[0] = 0;
      yin_print_open(out,level,(char *)0x0,"list","name",node->name,0);
      iVar4 = level + 1;
      yin_print_snode_common(out,iVar4,local_40,local_40->module,local_34,1);
      plVar13 = (lys_when *)local_40[1].name;
      if (plVar13 != (lys_when *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out,">\n");
          plVar13 = (lys_when *)local_40[1].name;
        }
        yin_print_when(out,iVar4,local_40->module,plVar13);
      }
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_iffeature(plStack_48,iVar4,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      if (local_40->padding[0] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_must(plStack_48,iVar4,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar19 < local_40->padding[0]);
      }
      plVar16 = plStack_48;
      if (local_40->padding[2] != '\0') {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_substmt(plVar16,iVar4,LYEXT_SUBSTMT_KEY,'\0',(char *)local_40[1].module,
                          local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      if (local_40->padding[3] != '\0') {
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_unique(plVar16,iVar4,local_40->module,
                           (lys_unique *)(local_40[1].ext + uVar19 * 2));
          plVar9 = local_40;
          pplVar15 = local_40->ext;
          iVar5 = -1;
          while (iVar5 = lys_ext_iter(pplVar15,plVar9->ext_size,(char)iVar5 + '\x01',
                                      LYEXT_SUBSTMT_UNIQUE), iVar5 != -1) {
            pplVar15 = plVar9->ext;
            if (uVar19 == pplVar15[iVar5]->insubstmt_index) {
              ly_print(plVar16,">\n");
              pplVar15 = local_40->ext;
              plVar9 = local_40;
              do {
                yin_print_extension_instances
                          (plVar16,level + 2,plVar9->module,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar19,
                           pplVar15 + iVar5,1);
                plVar9 = local_40;
                pplVar15 = local_40->ext;
                do {
                  iVar5 = lys_ext_iter(pplVar15,plVar9->ext_size,(char)iVar5 + '\x01',
                                       LYEXT_SUBSTMT_UNIQUE);
                  if (iVar5 == -1) {
                    iVar5 = 1;
                    goto LAB_0018e2b9;
                  }
                  pplVar15 = plVar9->ext;
                } while (uVar19 != pplVar15[iVar5]->insubstmt_index);
              } while( true );
            }
          }
          iVar5 = 0;
LAB_0018e2b9:
          yin_print_close(plVar16,iVar4,(char *)0x0,"unique",iVar5);
          uVar19 = uVar19 + 1;
        } while (uVar19 < local_40->padding[3]);
      }
      yin_print_snode_common(plVar16,iVar4,local_40,local_40->module,local_34,4);
      uVar2 = *(uint *)&local_40[1].iffeature;
      if (uVar2 != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
          uVar2 = *(uint *)&local_40[1].iffeature;
        }
        yin_print_unsigned(plVar16,iVar4,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,uVar2);
      }
      uVar2 = *(uint *)((long)&local_40[1].iffeature + 4);
      if (uVar2 != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
          uVar2 = *(uint *)((long)&local_40[1].iffeature + 4);
        }
        yin_print_unsigned(plVar16,iVar4,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,uVar2);
      }
      plVar9 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar5 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        if (iVar5 != -1) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          plVar6 = local_40->module;
          bVar1 = local_40->ext_size;
          pcVar14 = "system";
          goto LAB_0018e580;
        }
      }
      else {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
        }
        plVar6 = local_40->module;
        bVar1 = local_40->ext_size;
        pcVar14 = "user";
LAB_0018e580:
        plVar9 = local_40;
        yin_print_substmt(plVar16,iVar4,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar14,plVar6,local_40->ext,
                          (uint)bVar1);
      }
      yin_print_snode_common(plVar16,iVar4,plVar9,plVar9->module,local_34,0x70);
      if (plVar9->padding[1] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
            plVar9 = local_40;
          }
          yin_print_typedef(plStack_48,iVar4,plVar9->module,(lys_tpdf *)(plVar9[1].ref + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x80;
          plVar9 = local_40;
        } while (uVar19 < local_40->padding[1]);
      }
      plVar16 = plStack_48;
      plVar11 = plVar9->child;
      if (plVar11 != (lys_node *)0x0) {
        do {
          if (plVar11->parent == plVar9) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(plVar16,">\n");
            }
            yin_print_snode(plVar16,iVar4,plVar11,0x800);
            plVar9 = local_40;
          }
          plVar11 = plVar11->next;
        } while (plVar11 != (lys_node *)0x0);
        plVar11 = plVar9->child;
        if (plVar11 != (lys_node *)0x0) {
          do {
            if (plVar11->parent == plVar9) {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(plVar16,">\n");
              }
              yin_print_snode(plVar16,iVar4,plVar11,0x903f);
              plVar9 = local_40;
            }
            plVar11 = plVar11->next;
          } while (plVar11 != (lys_node *)0x0);
          plVar11 = plVar9->child;
          if (plVar11 != (lys_node *)0x0) {
            do {
              if (plVar11->parent == plVar9) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar16,">\n");
                }
                yin_print_snode(plVar16,iVar4,plVar11,0x4000);
                plVar9 = local_40;
              }
              plVar11 = plVar11->next;
            } while (plVar11 != (lys_node *)0x0);
            for (plVar11 = plVar9->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
              if (plVar11->parent == plVar9) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar16,">\n");
                }
                yin_print_snode(plVar16,iVar4,plVar11,0x80);
                plVar9 = local_40;
              }
            }
          }
        }
      }
      pcVar14 = "list";
      iVar4 = local_34[0];
    }
    else {
      if (LVar12 != LYS_ANYXML) {
        return;
      }
LAB_0018d195:
      local_34[0] = 0;
      plVar9 = lys_parent(node);
      pcVar8 = local_40->name;
      if (((plVar9 == (lys_node *)0x0) && (iVar4 = strcmp(pcVar8,"config"), iVar4 == 0)) &&
         (iVar4 = strcmp(local_40->module->name,"ietf-netconf"), iVar4 == 0)) {
        return;
      }
      plVar16 = plStack_48;
      pcVar14 = "anydata";
      if (local_40->nodetype == LYS_ANYXML) {
        pcVar14 = "anyxml";
      }
      yin_print_open(plStack_48,level,(char *)0x0,pcVar14,"name",pcVar8,0);
      iVar4 = level + 1;
      yin_print_snode_common(plVar16,iVar4,local_40,local_40->module,local_34,1);
      plVar13 = (lys_when *)local_40[1].name;
      if (plVar13 != (lys_when *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
          plVar13 = (lys_when *)local_40[1].name;
        }
        yin_print_when(plVar16,iVar4,local_40->module,plVar13);
      }
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_iffeature(plStack_48,iVar4,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      if (local_40->padding[3] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_must(plStack_48,iVar4,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar19 < local_40->padding[3]);
      }
      plVar16 = plStack_48;
      yin_print_snode_common(plStack_48,iVar4,local_40,local_40->module,local_34,0x7c);
      iVar4 = local_34[0];
    }
  }
  else if (LVar12 == LYS_CASE) {
    local_34[0] = 0;
    if ((node->flags & 0x40) == 0) {
      yin_print_open(out,level,(char *)0x0,"case","name",node->name,0);
      level = level + 1;
      yin_print_snode_common(out,level,local_40,local_40->module,local_34,1);
      plVar13 = *(lys_when **)local_40->hash;
      if (plVar13 != (lys_when *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
          plVar13 = *(lys_when **)local_40->hash;
        }
        out = plStack_48;
        yin_print_when(plStack_48,level,local_40->module,plVar13);
      }
      yin_print_snode_common(out,level,local_40,local_40->module,local_34,0x72);
    }
    else {
      local_34[0] = 1;
    }
    plVar11 = local_40;
    for (plVar9 = local_40->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
      if (plVar9->parent == plVar11) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_snode(plStack_48,level,plVar9,0x903f);
        plVar11 = local_40;
      }
    }
    if ((plVar11->flags & 0x40) != 0) {
      return;
    }
    level = level + -1;
    pcVar14 = "case";
    plVar16 = plStack_48;
    iVar4 = local_34[0];
  }
  else {
    if (LVar12 != LYS_NOTIF) {
      return;
    }
    local_34[0] = 0;
    yin_print_open(out,level,(char *)0x0,"notification","name",node->name,0);
    iVar4 = level + 1;
    yin_print_snode_common(out,iVar4,local_40,local_40->module,local_34,3);
    if (local_40->padding[1] != '\0') {
      lVar17 = 0;
      uVar19 = 0;
      do {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_must(plStack_48,iVar4,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + 0x38;
      } while (uVar19 < local_40->padding[1]);
    }
    yin_print_snode_common(plStack_48,iVar4,local_40,local_40->module,local_34,0x70);
    if (*(short *)(local_40->padding + 2) != 0) {
      lVar17 = 0;
      uVar19 = 0;
      do {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_typedef(plStack_48,iVar4,local_40->module,(lys_tpdf *)(local_40[1].name + lVar17))
        ;
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + 0x80;
      } while (uVar19 < *(ushort *)(local_40->padding + 2));
    }
    plVar16 = plStack_48;
    plVar9 = local_40->child;
    plVar11 = local_40;
    if (plVar9 != (lys_node *)0x0) {
      do {
        if (plVar9->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar4,plVar9,0x800);
          plVar11 = local_40;
        }
        plVar9 = plVar9->next;
      } while (plVar9 != (lys_node *)0x0);
      for (plVar9 = plVar11->child; plVar9 != (lys_node *)0x0; plVar9 = plVar9->next) {
        if (plVar9->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar4,plVar9,0x903f);
          plVar11 = local_40;
        }
      }
    }
    pcVar14 = "notification";
    iVar4 = local_34[0];
  }
LAB_0018e780:
  yin_print_close(plVar16,level,(char *)0x0,pcVar14,iVar4);
switchD_0018c6e9_caseD_3:
  return;
}

Assistant:

static void
yin_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yin_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yin_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yin_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yin_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yin_print_list(out, level, node);
        break;
    case LYS_USES:
        yin_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yin_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yin_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yin_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yin_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yin_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yin_print_notif(out, level, node);
        break;
    default:
        break;
    }
}